

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmInstallTargetGenerator::GetDestDirPath
          (string *__return_storage_ptr__,cmInstallTargetGenerator *this,string *file)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"$ENV{DESTDIR}","");
  pcVar1 = (file->_M_dataplus)._M_p;
  if ((*pcVar1 != '$') && (*pcVar1 != '/')) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar1 = (file->_M_dataplus)._M_p;
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallTargetGenerator::GetDestDirPath(std::string const& file)
{
  // Construct the path of the file on disk after installation on
  // which tweaks may be performed.
  std::string toDestDirPath = "$ENV{DESTDIR}";
  if(file[0] != '/' && file[0] != '$')
    {
    toDestDirPath += "/";
    }
  toDestDirPath += file;
  return toDestDirPath;
}